

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O3

void __thiscall QOpenGLTexture::setSize(QOpenGLTexture *this,int width,int height,int depth)

{
  Target TVar1;
  QOpenGLTexturePrivate *this_00;
  bool bVar2;
  uint uVar3;
  
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this->d_ptr).d)->storageAllocated == true) {
    setSize();
    return;
  }
  if (((((width & width - 1U) != 0) ||
       (uVar3 = height - ((uint)height >> 1 & 0x55555555),
       uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
       1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) ||
      (uVar3 = depth - ((uint)depth >> 1 & 0x55555555),
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
      1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) &&
     ((bVar2 = hasFeature(NPOTTextureRepeat), !bVar2 && (this_00->target != TargetRectangle)))) {
    QOpenGLTexturePrivate::setWrapMode(this_00,ClampToEdge);
  }
  TVar1 = this_00->target;
  if ((int)TVar1 < 0x8c18) {
    if ((int)TVar1 < 0x806f) {
      if (TVar1 == Target1D) goto LAB_00157ff4;
      if (TVar1 != Target2D) {
        return;
      }
    }
    else {
      if (TVar1 == Target3D) {
        this_00->dimensions[0] = width;
        this_00->dimensions[1] = height;
        this_00->dimensions[2] = depth;
        return;
      }
      if (TVar1 != TargetRectangle) {
        if (TVar1 != TargetCubeMap) {
          return;
        }
        goto LAB_00157feb;
      }
    }
LAB_00157fe2:
    this_00->dimensions[0] = width;
    this_00->dimensions[1] = height;
  }
  else {
    if ((int)TVar1 < 0x9009) {
      if (TVar1 != Target1DArray) {
        if (TVar1 == Target2DArray) goto LAB_00157fe2;
        if (TVar1 != TargetBuffer) {
          return;
        }
      }
    }
    else {
      if (TVar1 != TargetCubeMapArray) {
        if ((TVar1 != Target2DMultisample) && (TVar1 != Target2DMultisampleArray)) {
          return;
        }
        goto LAB_00157fe2;
      }
LAB_00157feb:
      if (width != height) {
        setSize();
      }
      this_00->dimensions[1] = width;
    }
LAB_00157ff4:
    this_00->dimensions[0] = width;
  }
  return;
}

Assistant:

void QOpenGLTexture::setSize(int width, int height, int depth)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot resize a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setSize()");
        return;
    }

    if (isNpot(width, height, depth) && !hasFeature(Feature::NPOTTextureRepeat) && d->target != Target::TargetRectangle)
        d->setWrapMode(WrapMode::ClampToEdge);

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::TargetBuffer:
        d->dimensions[0] = width;
        Q_UNUSED(height);
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
        if (width != height)
            qWarning("QAbstractOpenGLTexture::setSize(): Cube map textures must be square");
        d->dimensions[0] = d->dimensions[1] = width;
        Q_UNUSED(depth);
        break;

    case QOpenGLTexture::Target3D:
        d->dimensions[0] = width;
        d->dimensions[1] = height;
        d->dimensions[2] = depth;
        break;
    }
}